

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-seri.c
# Opt level: O3

void push_value(lua_State *L,read_block *rb,int type,int cookie)

{
  byte bVar1;
  int iVar2;
  lua_Integer lVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  
  switch(type) {
  case 0:
    lua_pushnil(L);
    return;
  case 1:
    lua_pushboolean(L,cookie);
    return;
  case 2:
    if (cookie != 8) {
      lVar3 = get_integer(L,rb,cookie);
      lua_pushinteger(L,lVar3);
      return;
    }
    uVar5 = rb->len;
    if (7 < (int)uVar5) {
      iVar2 = rb->ptr;
      rb->ptr = iVar2 + 8;
      uVar5 = uVar5 - 8;
      rb->len = uVar5;
      if (rb->buffer != (char *)0x0) {
        lua_pushnumber(L,*(lua_Number *)(rb->buffer + iVar2));
        return;
      }
    }
    uVar6 = (ulong)uVar5;
    uVar4 = 0x195;
    break;
  case 3:
    uVar5 = rb->len;
    if (7 < (int)uVar5) {
      iVar2 = rb->ptr;
      rb->ptr = iVar2 + 8;
      uVar5 = uVar5 - 8;
      rb->len = uVar5;
      if (rb->buffer != (char *)0x0) {
        lua_pushlightuserdata(L,*(void **)(rb->buffer + iVar2));
        return;
      }
    }
    uVar6 = (ulong)uVar5;
    uVar4 = 0x19f;
    break;
  case 4:
LAB_001177ed:
    get_buffer(L,rb,cookie);
    return;
  case 5:
    if (cookie == 4) {
      uVar5 = rb->len;
      if (3 < (int)uVar5) {
        iVar2 = rb->ptr;
        rb->ptr = iVar2 + 4;
        uVar5 = uVar5 - 4;
        rb->len = uVar5;
        if (rb->buffer != (char *)0x0) {
          cookie = *(int *)(rb->buffer + iVar2);
          goto LAB_001177ed;
        }
      }
      uVar6 = (ulong)uVar5;
      uVar4 = 0x1f6;
    }
    else {
      if (cookie != 2) {
        luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x1f2);
      }
      uVar5 = rb->len;
      if (1 < (int)uVar5) {
        iVar2 = rb->ptr;
        rb->ptr = iVar2 + 2;
        uVar5 = uVar5 - 2;
        rb->len = uVar5;
        if (rb->buffer != (char *)0x0) {
          cookie = (int)*(ushort *)(rb->buffer + iVar2);
          goto LAB_001177ed;
        }
      }
      uVar6 = (ulong)uVar5;
      uVar4 = 0x1eb;
    }
    break;
  case 6:
    if (cookie != 0x1f) {
LAB_001176ee:
      luaL_checkstack(L,0x14,(char *)0x0);
      lua_createtable(L,cookie,0);
      if (0 < cookie) {
        uVar6 = 1;
        do {
          unpack_one(L,rb);
          lua_rawseti(L,-2,uVar6);
          uVar6 = uVar6 + 1;
        } while (cookie + 1 != uVar6);
      }
      while( true ) {
        unpack_one(L,rb);
        iVar2 = lua_type(L,-1);
        if (iVar2 == 0) break;
        unpack_one(L,rb);
        lua_rawset(L,-3);
      }
      lua_settop(L,-2);
      return;
    }
    uVar5 = rb->len;
    uVar6 = (ulong)uVar5;
    if (0 < (int)uVar5) {
      iVar2 = rb->ptr;
      rb->ptr = iVar2 + 1;
      uVar6 = (ulong)(uVar5 - 1);
      rb->len = uVar5 - 1;
      if (rb->buffer != (char *)0x0) {
        bVar1 = rb->buffer[iVar2];
        uVar5 = (uint)(bVar1 >> 3);
        if ((bVar1 & 7) != 2 || uVar5 == 8) {
          luaL_error(L,"Invalid serialize stream %d (line:%d)",uVar6,0x1bb);
        }
        lVar3 = get_integer(L,rb,uVar5);
        cookie = (int)lVar3;
        goto LAB_001176ee;
      }
    }
    uVar4 = 0x1b6;
    break;
  default:
    luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x203);
  }
  luaL_error(L,"Invalid serialize stream %d (line:%d)",uVar6,uVar4);
}

Assistant:

static void
push_value(lua_State *L, struct read_block *rb, int type, int cookie) {
	switch(type) {
	case TYPE_NIL:
		lua_pushnil(L);
		break;
	case TYPE_BOOLEAN:
		lua_pushboolean(L,cookie);
		break;
	case TYPE_NUMBER:
		if (cookie == TYPE_NUMBER_REAL) {
			lua_pushnumber(L,get_real(L,rb));
		} else {
			lua_pushinteger(L, get_integer(L, rb, cookie));
		}
		break;
	case TYPE_USERDATA:
		lua_pushlightuserdata(L,get_pointer(L,rb));
		break;
	case TYPE_SHORT_STRING:
		get_buffer(L,rb,cookie);
		break;
	case TYPE_LONG_STRING: {
		if (cookie == 2) {
			uint16_t *plen = rb_read(rb, 2);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint16_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		} else {
			if (cookie != 4) {
				invalid_stream(L,rb);
			}
			uint32_t *plen = rb_read(rb, 4);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint32_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		}
		break;
	}
	case TYPE_TABLE: {
		unpack_table(L,rb,cookie);
		break;
	}
	default: {
		invalid_stream(L,rb);
		break;
	}
	}
}